

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  Allocator *pAVar7;
  pointer pMVar8;
  long *plVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  Layer *pLVar14;
  undefined4 extraout_var_00;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  DataReader *pDVar18;
  pointer pBVar19;
  int *piVar20;
  long lVar21;
  size_t *psVar22;
  long lVar23;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  int local_3e8;
  int local_3e4;
  Layer *local_3e0;
  DataReader *local_3d8;
  Net *local_3d0;
  long local_3c8;
  int local_3c0;
  int local_3bc;
  vector<int,_std::allocator<int>_> *local_3b8;
  vector<int,_std::allocator<int>_> *local_3b0;
  ulong local_3a8;
  int local_39c;
  ParamDict local_398;
  Mat local_388;
  string *local_340;
  Mat local_338 [3];
  char local_238 [256];
  char local_138 [264];
  
  local_39c = 0;
  iVar12 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar12 == 1) {
    if (local_39c == 0x7685dd) {
      local_3bc = 0;
      local_3c0 = 0;
      iVar12 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar12 == 1) {
        iVar12 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3c0);
        if (iVar12 == 1) {
          if ((0 < (long)local_3bc) && (0 < local_3c0)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_3bc);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_3c0);
            ParamDict::ParamDict(&local_398);
            bVar10 = 0 < local_3bc;
            if (0 < local_3bc) {
              local_3c8 = 0;
              uVar17 = 0;
              local_3d8 = dr;
              local_3d0 = this;
              do {
                psVar22 = &local_338[0].elemsize;
                local_3e4 = 0;
                local_3e8 = 0;
                iVar12 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_238);
                if (iVar12 == 1) {
                  iVar12 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_138);
                  if (iVar12 != 1) {
                    load_param();
                    goto LAB_0016d21d;
                  }
                  iVar12 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3e4);
                  if (iVar12 != 1) {
                    load_param();
                    goto LAB_0016d21d;
                  }
                  iVar12 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3e8);
                  if (iVar12 != 1) {
                    load_param();
                    goto LAB_0016d21d;
                  }
                  iVar12 = (*this->_vptr_Net[4])(this,local_238);
                  pLVar14 = (Layer *)CONCAT44(extraout_var,iVar12);
                  if (pLVar14 == (Layer *)0x0) {
                    pLVar14 = create_layer(local_238);
                  }
                  if (pLVar14 == (Layer *)0x0) {
                    iVar12 = (*this->_vptr_Net[3])(this,local_238);
                    pLVar14 = (Layer *)CONCAT44(extraout_var_00,iVar12);
                  }
                  if (pLVar14 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %s not exists or registered",local_238);
                    fputc(10,_stderr);
                    this = local_3d0;
                    clear(local_3d0);
                    iVar12 = 1;
                  }
                  else {
                    local_3e0 = pLVar14;
                    local_338[0].data = psVar22;
                    sVar15 = strlen(local_238);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,local_238,local_238 + sVar15);
                    std::__cxx11::string::operator=((string *)&local_3e0->type,(string *)local_338);
                    if ((size_t *)local_338[0].data != psVar22) {
                      operator_delete(local_338[0].data,
                                      CONCAT44(local_338[0].elemsize._4_4_,
                                               (undefined4)local_338[0].elemsize) + 1);
                    }
                    local_338[0].data = psVar22;
                    sVar15 = strlen(local_138);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_338,local_138,local_138 + sVar15);
                    local_340 = &local_3e0->name;
                    std::__cxx11::string::operator=((string *)local_340,(string *)local_338);
                    this = local_3d0;
                    if ((size_t *)local_338[0].data != psVar22) {
                      operator_delete(local_338[0].data,
                                      CONCAT44(local_338[0].elemsize._4_4_,
                                               (undefined4)local_338[0].elemsize) + 1);
                    }
                    local_3b0 = &local_3e0->bottoms;
                    std::vector<int,_std::allocator<int>_>::resize(local_3b0,(long)local_3e4);
                    uVar16 = (ulong)(0 < local_3e4);
                    iVar12 = 0x19;
                    if (0 < local_3e4) {
                      lVar21 = 0;
                      do {
                        local_3b8 = (vector<int,_std::allocator<int>_> *)
                                    CONCAT71(local_3b8._1_7_,(char)uVar16);
                        iVar12 = (*local_3d8->_vptr_DataReader[2])(local_3d8,"%255s",local_338);
                        if (iVar12 == 1) {
                          iVar13 = find_blob_index_by_name(this,(char *)local_338);
                          if (iVar13 == -1) {
                            pBVar19 = (this->d->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start;
                            local_388.data = &local_388.elemsize;
                            sVar15 = strlen((char *)local_338);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_388,local_338,
                                       (long)&local_338[0].data + sVar15);
                            iVar13 = (int)uVar17;
                            std::__cxx11::string::operator=
                                      ((string *)(pBVar19 + iVar13),(string *)&local_388);
                            if ((size_t *)local_388.data != &local_388.elemsize) {
                              operator_delete(local_388.data,
                                              CONCAT44(local_388.elemsize._4_4_,
                                                       (undefined4)local_388.elemsize) + 1);
                            }
                            uVar17 = (ulong)(iVar13 + 1);
                            this = local_3d0;
                          }
                          (this->d->blobs).
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar13].consumer = (int)local_3c8;
                          (local_3b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar21] = iVar13;
                        }
                        else {
                          load_param();
                        }
                        if (iVar12 != 1) {
                          iVar12 = 1;
                          uVar16 = (ulong)local_3b8 & 0xff;
                          goto LAB_0016cfee;
                        }
                        lVar21 = lVar21 + 1;
                        uVar16 = (ulong)(lVar21 < local_3e4);
                      } while (lVar21 < local_3e4);
                      iVar12 = 0x19;
                    }
LAB_0016cfee:
                    dr = local_3d8;
                    if ((uVar16 & 1) == 0) {
                      local_3b8 = &local_3e0->tops;
                      std::vector<int,_std::allocator<int>_>::resize(local_3b8,(long)local_3e8);
                      bVar11 = 0 < local_3e8;
                      iVar12 = 0x1e;
                      if (0 < local_3e8) {
                        lVar21 = 0;
                        pDVar18 = local_3d8;
                        do {
                          iVar13 = (int)uVar17;
                          pBVar19 = (this->d->blobs).
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                    _M_impl.super__Vector_impl_data._M_start + iVar13;
                          iVar12 = (*pDVar18->_vptr_DataReader[2])(pDVar18,"%255s",local_338);
                          local_3a8 = CONCAT44(local_3a8._4_4_,iVar12);
                          if (iVar12 == 1) {
                            local_388.data = &local_388.elemsize;
                            sVar15 = strlen((char *)local_338);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_388,local_338,
                                       (long)&local_338[0].data + sVar15);
                            std::__cxx11::string::operator=((string *)pBVar19,(string *)&local_388);
                            if ((size_t *)local_388.data != &local_388.elemsize) {
                              operator_delete(local_388.data,
                                              CONCAT44(local_388.elemsize._4_4_,
                                                       (undefined4)local_388.elemsize) + 1);
                            }
                            pBVar19->producer = (int)local_3c8;
                            (local_3b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar21] = iVar13;
                            uVar17 = (ulong)(iVar13 + 1);
                            pDVar18 = local_3d8;
                            this = local_3d0;
                          }
                          else {
                            load_param();
                          }
                          if ((int)local_3a8 != 1) {
                            iVar12 = 1;
                            goto LAB_0016d161;
                          }
                          lVar21 = lVar21 + 1;
                          bVar11 = lVar21 < local_3e8;
                        } while (lVar21 < local_3e8);
                        iVar12 = 0x1e;
                      }
LAB_0016d161:
                      dr = local_3d8;
                      if (!bVar11) {
                        iVar12 = ParamDict::load_param(&local_398,local_3d8);
                        if (iVar12 == 0) {
                          if (local_3e0->support_int8_storage == true) {
                            (this->opt).use_vulkan_compute = false;
                          }
                          local_388.cstep = 0;
                          local_388.data = (void *)0x0;
                          local_388.refcount._0_4_ = 0;
                          local_388.refcount._4_4_ = 0;
                          local_388.elemsize._0_4_ = 0;
                          local_388.elemsize._4_4_ = 0;
                          local_388.elempack = 0;
                          local_388.h = 0;
                          local_388.d = 0;
                          local_388.c = 0;
                          local_388.allocator = (Allocator *)0x0;
                          local_388.dims = 0;
                          local_388.w = 0;
                          ParamDict::get(local_338,&local_398,0x1e,&local_388);
                          piVar20 = (int *)CONCAT44(local_388.refcount._4_4_,
                                                    local_388.refcount._0_4_);
                          if (piVar20 != (int *)0x0) {
                            LOCK();
                            *piVar20 = *piVar20 + -1;
                            UNLOCK();
                            if (*piVar20 == 0) {
                              if (local_388.allocator == (Allocator *)0x0) {
                                if (local_388.data != (void *)0x0) {
                                  free(local_388.data);
                                }
                              }
                              else {
                                (*(local_388.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_388.cstep = 0;
                          local_388.data = (size_t *)0x0;
                          local_388.refcount._0_4_ = 0;
                          local_388.refcount._4_4_ = 0;
                          local_388.elemsize._0_4_ = 0;
                          local_388.elemsize._4_4_ = 0;
                          local_388.elempack = 0;
                          local_388.dims = 0;
                          local_388.w = 0;
                          local_388.h = 0;
                          local_388.d = 0;
                          local_388.c = 0;
                          local_3a8 = uVar17;
                          if ((((size_t *)local_338[0].data != (size_t *)0x0) &&
                              ((long)local_338[0].c * local_338[0].cstep != 0)) && (0 < local_3e8))
                          {
                            piVar20 = (int *)((long)local_338[0].data + 0xc);
                            lVar21 = 0;
                            do {
                              iVar12 = (local_3b8->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar21];
                              pBVar19 = (local_3d0->d->blobs).
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                        _M_impl.super__Vector_impl_data._M_start;
                              iVar13 = piVar20[-3];
                              if (iVar13 == 3) {
LAB_0016d43f:
                                iVar13 = piVar20[-2];
                                iVar3 = piVar20[-1];
                                iVar4 = *piVar20;
                                piVar5 = pBVar19[iVar12].shape.refcount;
                                if (piVar5 != (int *)0x0) {
                                  LOCK();
                                  *piVar5 = *piVar5 + -1;
                                  UNLOCK();
                                  if (*piVar5 == 0) {
                                    pvVar6 = pBVar19[iVar12].shape.data;
                                    pAVar7 = pBVar19[iVar12].shape.allocator;
                                    if (pAVar7 == (Allocator *)0x0) {
                                      if (pvVar6 != (void *)0x0) {
                                        free(pvVar6);
                                      }
                                    }
                                    else {
                                      (*pAVar7->_vptr_Allocator[3])();
                                    }
                                  }
                                }
                                pBVar19[iVar12].shape.cstep = 0;
                                *(undefined8 *)((long)&pBVar19[iVar12].shape.refcount + 4) = 0;
                                *(undefined8 *)((long)&pBVar19[iVar12].shape.elemsize + 4) = 0;
                                pBVar19[iVar12].shape.data = (void *)0x0;
                                pBVar19[iVar12].shape.refcount = (int *)0x0;
                                pBVar19[iVar12].shape.dims = 0;
                                pBVar19[iVar12].shape.w = 0;
                                pBVar19[iVar12].shape.h = 0;
                                pBVar19[iVar12].shape.d = 0;
                                pBVar19[iVar12].shape.elemsize = 4;
                                pBVar19[iVar12].shape.elempack = 1;
                                pBVar19[iVar12].shape.allocator = (Allocator *)0x0;
                                pBVar19[iVar12].shape.dims = 3;
                                pBVar19[iVar12].shape.w = iVar13;
                                pBVar19[iVar12].shape.h = iVar3;
                                pBVar19[iVar12].shape.d = 1;
                                pBVar19[iVar12].shape.c = iVar4;
                                pBVar19[iVar12].shape.cstep =
                                     (long)iVar3 * (long)iVar13 + 3U & 0x3ffffffffffffffc;
                              }
                              else if (iVar13 == 2) {
                                iVar3 = piVar20[-2];
                                iVar4 = piVar20[-1];
                                piVar5 = pBVar19[iVar12].shape.refcount;
                                if (piVar5 != (int *)0x0) {
                                  LOCK();
                                  *piVar5 = *piVar5 + -1;
                                  UNLOCK();
                                  if (*piVar5 == 0) {
                                    pvVar6 = pBVar19[iVar12].shape.data;
                                    pAVar7 = pBVar19[iVar12].shape.allocator;
                                    if (pAVar7 == (Allocator *)0x0) {
                                      if (pvVar6 != (void *)0x0) {
                                        free(pvVar6);
                                      }
                                    }
                                    else {
                                      (*pAVar7->_vptr_Allocator[3])();
                                    }
                                  }
                                }
                                pBVar19[iVar12].shape.cstep = 0;
                                *(undefined8 *)((long)&pBVar19[iVar12].shape.refcount + 4) = 0;
                                *(undefined8 *)((long)&pBVar19[iVar12].shape.elemsize + 4) = 0;
                                pBVar19[iVar12].shape.data = (void *)0x0;
                                pBVar19[iVar12].shape.refcount = (int *)0x0;
                                pBVar19[iVar12].shape.dims = 0;
                                pBVar19[iVar12].shape.w = 0;
                                pBVar19[iVar12].shape.h = 0;
                                pBVar19[iVar12].shape.d = 0;
                                pBVar19[iVar12].shape.elemsize = 4;
                                pBVar19[iVar12].shape.elempack = 1;
                                pBVar19[iVar12].shape.allocator = (Allocator *)0x0;
                                pBVar19[iVar12].shape.dims = 2;
                                pBVar19[iVar12].shape.w = iVar3;
                                pBVar19[iVar12].shape.h = iVar4;
                                pBVar19[iVar12].shape.d = 1;
                                pBVar19[iVar12].shape.c = 1;
                                pBVar19[iVar12].shape.cstep = (long)iVar4 * (long)iVar3;
LAB_0016d435:
                                if (iVar13 == 3) goto LAB_0016d43f;
                              }
                              else if (iVar13 == 1) {
                                iVar3 = piVar20[-2];
                                piVar5 = pBVar19[iVar12].shape.refcount;
                                if (piVar5 != (int *)0x0) {
                                  LOCK();
                                  *piVar5 = *piVar5 + -1;
                                  UNLOCK();
                                  if (*piVar5 == 0) {
                                    pvVar6 = pBVar19[iVar12].shape.data;
                                    pAVar7 = pBVar19[iVar12].shape.allocator;
                                    if (pAVar7 == (Allocator *)0x0) {
                                      if (pvVar6 != (void *)0x0) {
                                        free(pvVar6);
                                      }
                                    }
                                    else {
                                      (*pAVar7->_vptr_Allocator[3])();
                                    }
                                  }
                                }
                                pBVar19[iVar12].shape.cstep = 0;
                                *(undefined8 *)((long)&pBVar19[iVar12].shape.refcount + 4) = 0;
                                *(undefined8 *)((long)&pBVar19[iVar12].shape.elemsize + 4) = 0;
                                pBVar19[iVar12].shape.data = (void *)0x0;
                                pBVar19[iVar12].shape.refcount = (int *)0x0;
                                pBVar19[iVar12].shape.dims = 0;
                                pBVar19[iVar12].shape.w = 0;
                                pBVar19[iVar12].shape.h = 0;
                                pBVar19[iVar12].shape.d = 0;
                                pBVar19[iVar12].shape.elemsize = 4;
                                pBVar19[iVar12].shape.elempack = 1;
                                pBVar19[iVar12].shape.allocator = (Allocator *)0x0;
                                pBVar19[iVar12].shape.dims = 1;
                                pBVar19[iVar12].shape.w = iVar3;
                                pBVar19[iVar12].shape.h = 1;
                                pBVar19[iVar12].shape.d = 1;
                                pBVar19[iVar12].shape.c = 1;
                                pBVar19[iVar12].shape.cstep = (long)iVar3;
                                goto LAB_0016d435;
                              }
                              lVar21 = lVar21 + 1;
                              piVar20 = piVar20 + 4;
                            } while (lVar21 < local_3e8);
                          }
                          pvVar1 = &local_3e0->bottom_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_3e4);
                          if (0 < local_3e4) {
                            lVar23 = 0;
                            lVar21 = 0;
                            do {
                              iVar12 = (local_3b0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar21];
                              pBVar19 = (local_3d0->d->blobs).
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                        _M_impl.super__Vector_impl_data._M_start;
                              pMVar8 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar8->data + lVar23);
                              if ((Mat *)puVar2 != &pBVar19[iVar12].shape) {
                                piVar20 = pBVar19[iVar12].shape.refcount;
                                if (piVar20 != (int *)0x0) {
                                  LOCK();
                                  *piVar20 = *piVar20 + 1;
                                  UNLOCK();
                                }
                                piVar20 = *(int **)((long)&pMVar8->refcount + lVar23);
                                if (piVar20 != (int *)0x0) {
                                  LOCK();
                                  *piVar20 = *piVar20 + -1;
                                  UNLOCK();
                                  if (*piVar20 == 0) {
                                    pvVar6 = *(void **)((long)&pMVar8->data + lVar23);
                                    plVar9 = *(long **)((long)&pMVar8->allocator + lVar23);
                                    if (plVar9 == (long *)0x0) {
                                      if (pvVar6 != (void *)0x0) {
                                        free(pvVar6);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar9 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)&pMVar8->cstep + lVar23) = 0;
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar23);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)((long)&pMVar8->c + lVar23) = 0;
                                piVar20 = pBVar19[iVar12].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar8->data + lVar23);
                                *puVar2 = pBVar19[iVar12].shape.data;
                                puVar2[1] = piVar20;
                                *(size_t *)((long)&pMVar8->elemsize + lVar23) =
                                     pBVar19[iVar12].shape.elemsize;
                                *(int *)((long)&pMVar8->elempack + lVar23) =
                                     pBVar19[iVar12].shape.elempack;
                                *(Allocator **)((long)&pMVar8->allocator + lVar23) =
                                     pBVar19[iVar12].shape.allocator;
                                iVar13 = pBVar19[iVar12].shape.w;
                                iVar3 = pBVar19[iVar12].shape.h;
                                iVar4 = pBVar19[iVar12].shape.d;
                                piVar20 = (int *)((long)&pMVar8->dims + lVar23);
                                *piVar20 = pBVar19[iVar12].shape.dims;
                                piVar20[1] = iVar13;
                                piVar20[2] = iVar3;
                                piVar20[3] = iVar4;
                                *(int *)((long)&pMVar8->c + lVar23) = pBVar19[iVar12].shape.c;
                                *(size_t *)((long)&pMVar8->cstep + lVar23) =
                                     pBVar19[iVar12].shape.cstep;
                              }
                              lVar21 = lVar21 + 1;
                              lVar23 = lVar23 + 0x48;
                            } while (lVar21 < local_3e4);
                          }
                          this = local_3d0;
                          pvVar1 = &local_3e0->top_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_3e8);
                          if (0 < local_3e8) {
                            lVar21 = 0;
                            lVar23 = 0;
                            do {
                              iVar12 = (local_3b8->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar23];
                              pBVar19 = (this->d->blobs).
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                        _M_impl.super__Vector_impl_data._M_start;
                              pMVar8 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar8->data + lVar21);
                              if ((Mat *)puVar2 != &pBVar19[iVar12].shape) {
                                piVar20 = pBVar19[iVar12].shape.refcount;
                                if (piVar20 != (int *)0x0) {
                                  LOCK();
                                  *piVar20 = *piVar20 + 1;
                                  UNLOCK();
                                }
                                piVar20 = *(int **)((long)&pMVar8->refcount + lVar21);
                                if (piVar20 != (int *)0x0) {
                                  LOCK();
                                  *piVar20 = *piVar20 + -1;
                                  UNLOCK();
                                  if (*piVar20 == 0) {
                                    pvVar6 = *(void **)((long)&pMVar8->data + lVar21);
                                    plVar9 = *(long **)((long)&pMVar8->allocator + lVar21);
                                    if (plVar9 == (long *)0x0) {
                                      if (pvVar6 != (void *)0x0) {
                                        free(pvVar6);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar9 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)&pMVar8->cstep + lVar21) = 0;
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar21);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)((long)&pMVar8->c + lVar21) = 0;
                                piVar20 = pBVar19[iVar12].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar8->data + lVar21);
                                *puVar2 = pBVar19[iVar12].shape.data;
                                puVar2[1] = piVar20;
                                *(size_t *)((long)&pMVar8->elemsize + lVar21) =
                                     pBVar19[iVar12].shape.elemsize;
                                *(int *)((long)&pMVar8->elempack + lVar21) =
                                     pBVar19[iVar12].shape.elempack;
                                *(Allocator **)((long)&pMVar8->allocator + lVar21) =
                                     pBVar19[iVar12].shape.allocator;
                                iVar13 = pBVar19[iVar12].shape.w;
                                iVar3 = pBVar19[iVar12].shape.h;
                                iVar4 = pBVar19[iVar12].shape.d;
                                piVar20 = (int *)((long)&pMVar8->dims + lVar21);
                                *piVar20 = pBVar19[iVar12].shape.dims;
                                piVar20[1] = iVar13;
                                piVar20[2] = iVar3;
                                piVar20[3] = iVar4;
                                *(int *)((long)&pMVar8->c + lVar21) = pBVar19[iVar12].shape.c;
                                *(size_t *)((long)&pMVar8->cstep + lVar21) =
                                     pBVar19[iVar12].shape.cstep;
                              }
                              lVar23 = lVar23 + 1;
                              lVar21 = lVar21 + 0x48;
                              this = local_3d0;
                            } while (lVar23 < local_3e8);
                          }
                          iVar12 = ParamDict::get(&local_398,0x1f,0);
                          local_3e0->featmask = iVar12;
                          iVar12 = (*local_3e0->_vptr_Layer[2])(local_3e0,&local_398);
                          uVar17 = local_3a8;
                          if (iVar12 == 0) {
                            (this->d->layers).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_3c8] = local_3e0;
                            local_3b0 = (vector<int,_std::allocator<int>_> *)
                                        ((ulong)local_3b0 & 0xffffffff00000000);
                          }
                          else {
                            load_param();
                            local_3b0 = (vector<int,_std::allocator<int>_> *)
                                        CONCAT44(local_3b0._4_4_,0xe);
                          }
                          dr = local_3d8;
                          piVar20 = (int *)CONCAT44(local_338[0].refcount._4_4_,
                                                    local_338[0].refcount._0_4_);
                          if (piVar20 != (int *)0x0) {
                            LOCK();
                            *piVar20 = *piVar20 + -1;
                            UNLOCK();
                            if (*piVar20 == 0) {
                              if (local_338[0].allocator == (Allocator *)0x0) {
                                if ((size_t *)local_338[0].data != (size_t *)0x0) {
                                  free(local_338[0].data);
                                }
                              }
                              else {
                                (*(local_338[0].allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_338[0].cstep = 0;
                          local_338[0].data = (size_t *)0x0;
                          local_338[0].refcount._0_4_ = 0;
                          local_338[0].refcount._4_4_ = 0;
                          local_338[0].elemsize._0_4_ = 0;
                          local_338[0].elemsize._4_4_ = 0;
                          local_338[0].elempack = 0;
                          local_338[0].dims = 0;
                          local_338[0].w = 0;
                          local_338[0].h = 0;
                          local_338[0].d = 0;
                          local_338[0].c = 0;
                          iVar12 = (int)local_3b0;
                        }
                        else {
                          load_param();
                          iVar12 = 0xe;
                        }
                      }
                    }
                  }
                }
                else {
                  load_param();
LAB_0016d21d:
                  iVar12 = 1;
                }
                if ((iVar12 != 0xe) && (iVar12 != 0)) {
                  iVar12 = -1;
                  if (bVar10) goto LAB_0016d88b;
                  break;
                }
                local_3c8 = local_3c8 + 1;
                bVar10 = local_3c8 < local_3bc;
              } while (local_3c8 < local_3bc);
            }
            NetPrivate::update_input_output_indexes(this->d);
            iVar12 = 0;
            NetPrivate::update_input_output_names(this->d);
LAB_0016d88b:
            ParamDict::~ParamDict(&local_398);
            return iVar12;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_overwrite_builtin_layer(layer_type);
        if (!layer)
        {
            layer = create_layer(layer_type);
        }
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}